

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O1

void mocker::anon_unknown_0::genCall
               (Section *text,FuncSelectionContext *ctx,shared_ptr<mocker::ir::Call> *p)

{
  element_type *peVar1;
  element_type *peVar2;
  pointer psVar3;
  uint uVar4;
  int iVar5;
  shared_ptr<mocker::nasm::Register> *psVar6;
  long lVar7;
  shared_ptr<mocker::ir::Call> *psVar8;
  char *__end;
  size_t i;
  ulong uVar9;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l;
  shared_ptr<mocker::nasm::Addr> retVal;
  shared_ptr<mocker::nasm::Register> tmp;
  shared_ptr<mocker::nasm::Register> rspCopy;
  Section *local_c0;
  undefined1 local_b8 [16];
  element_type local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  element_type *local_78;
  __node_base local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  undefined1 local_58 [24];
  __node_base local_38;
  
  local_c0 = text;
  if ((anonymous_namespace)::
      genCall(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::Call>const&)
      ::ParamRegs == '\0') {
    iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 genCall(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::Call>const&)
                                 ::ParamRegs);
    if (iVar5 != 0) {
      psVar6 = nasm::rdi();
      local_b8._0_8_ =
           (psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_b8._8_8_ =
           (psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
        }
      }
      psVar6 = nasm::rsi();
      local_a8.super_Addr._vptr_Addr =
           (_func_int **)
           (psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_a8.identifier._M_dataplus._M_p =
           (pointer)(psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.identifier._M_dataplus._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.identifier._M_dataplus._M_p)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_a8.identifier._M_dataplus._M_p)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.identifier._M_dataplus._M_p)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_a8.identifier._M_dataplus._M_p)->_M_use_count + 1;
        }
      }
      psVar6 = nasm::rdx();
      local_a8.identifier._M_string_length =
           (size_type)
           (psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_a8.identifier.field_2._M_allocated_capacity =
           (size_type)
           (psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_a8.identifier.field_2._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_a8.identifier.field_2._M_allocated_capacity)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.identifier.field_2._M_allocated_capacity)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_a8.identifier.field_2._M_allocated_capacity)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.identifier.field_2._M_allocated_capacity)->_M_use_count + 1;
        }
      }
      psVar6 = nasm::rcx();
      local_a8.identifier.field_2._8_8_ =
           (psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_80 = (psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
      if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_80->_M_use_count = local_80->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_80->_M_use_count = local_80->_M_use_count + 1;
        }
      }
      psVar6 = nasm::r8();
      local_78 = (psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      local_70._M_nxt =
           (_Hash_node_base *)
           (psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_nxt !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_nxt)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_nxt)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_nxt)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_nxt)->_M_use_count + 1;
        }
      }
      psVar6 = nasm::r9();
      local_68 = (psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      local_60 = (psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_60->_M_use_count = local_60->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_60->_M_use_count = local_60->_M_use_count + 1;
        }
      }
      __l._M_len = 6;
      __l._M_array = (iterator)local_b8;
      std::
      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::vector(&genCall::ParamRegs,__l,(allocator_type *)&stack0xffffffffffffffc0);
      lVar7 = 0x60;
      do {
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_c0 + lVar7) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_c0 + lVar7));
        }
        lVar7 = lVar7 + -0x10;
      } while (lVar7 != 0);
      __cxa_atexit(std::
                   vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ::~vector,&genCall::ParamRegs,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           genCall(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::Call>const&)
                           ::ParamRegs);
    }
  }
  local_b8._0_8_ = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"");
  FuncSelectionContext::newVirtualReg
            ((FuncSelectionContext *)&stack0xffffffffffffffc0,(string *)ctx);
  if ((element_type *)local_b8._0_8_ != &local_a8) {
    operator_delete((void *)local_b8._0_8_,(ulong)((long)local_a8.super_Addr._vptr_Addr + 1));
  }
  if (nasm::rsp()::res == '\0') {
    iVar5 = __cxa_guard_acquire(&nasm::rsp()::res);
    if (iVar5 != 0) {
      nasm::rsp::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                (&nasm::rsp::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(Register **)&nasm::rsp::res,(allocator<mocker::nasm::Register> *)local_b8,
                 (char (*) [4])"rsp");
      __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&nasm::rsp::res,&__dso_handle);
      __cxa_guard_release(&nasm::rsp()::res);
    }
  }
  nasm::Section::
  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
            (local_c0,(shared_ptr<mocker::nasm::Register> *)&stack0xffffffffffffffc0,&nasm::rsp::res
            );
  lVar7 = 0;
  uVar9 = 0;
  do {
    psVar3 = genCall::ParamRegs.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar1 = (p->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((ulong)((long)(peVar1->args).
                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(peVar1->args).
                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar9) break;
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_b8,(shared_ptr<mocker::ir::Addr> *)ctx);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>>
              (local_c0,(shared_ptr<mocker::nasm::Register> *)
                        ((long)&(psVar3->
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar7),(shared_ptr<mocker::nasm::Addr> *)local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
    uVar9 = uVar9 + 1;
    lVar7 = lVar7 + 0x10;
  } while (uVar9 != 6);
  peVar1 = (p->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar4 = (int)((ulong)((long)(peVar1->args).
                              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar1->args).
                             super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1;
  local_58._16_8_ = p;
  if (5 < (int)uVar4) {
    lVar7 = (ulong)uVar4 + 1;
    do {
      local_b8._0_8_ = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"","");
      FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_58,(string *)ctx);
      if ((element_type *)local_b8._0_8_ != &local_a8) {
        operator_delete((void *)local_b8._0_8_,(ulong)((long)local_a8.super_Addr._vptr_Addr + 1));
      }
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)local_b8,(shared_ptr<mocker::ir::Addr> *)ctx);
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
                (local_c0,(shared_ptr<mocker::nasm::Register> *)local_58,
                 (shared_ptr<mocker::nasm::Addr> *)local_b8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      nasm::Section::emplaceInst<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Register>&>
                (local_c0,(shared_ptr<mocker::nasm::Register> *)local_58);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
      lVar7 = lVar7 + -1;
    } while (6 < lVar7);
  }
  psVar8 = (shared_ptr<mocker::ir::Call> *)local_58._16_8_;
  renameIdentifier((string *)local_b8,
                   &((__shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2> *)local_58._16_8_)
                    ->_M_ptr->funcName);
  nasm::Section::emplaceInst<mocker::nasm::Call,std::__cxx11::string>
            (local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8)
  ;
  if ((element_type *)local_b8._0_8_ != &local_a8) {
    operator_delete((void *)local_b8._0_8_,(ulong)((long)local_a8.super_Addr._vptr_Addr + 1));
  }
  peVar1 = (psVar8->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar2 = (peVar1->super_Definition).dest.
           super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    local_58._8_8_ =
         (peVar1->super_Definition).dest.
         super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_)->_M_use_count + 1;
      }
    }
    local_58._0_8_ = peVar2;
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_b8,(shared_ptr<mocker::ir::Addr> *)ctx);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    if (nasm::rax()::res == '\0') {
      iVar5 = __cxa_guard_acquire(&nasm::rax()::res);
      if (iVar5 != 0) {
        nasm::rax::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::rax::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::rax::res,
                   (allocator<mocker::nasm::Register> *)local_58,(char (*) [4])"rax");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::rax::res,&__dso_handle);
        __cxa_guard_release(&nasm::rax()::res);
        psVar8 = (shared_ptr<mocker::ir::Call> *)local_58._16_8_;
      }
    }
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Register>const&>
              (local_c0,(shared_ptr<mocker::nasm::Addr> *)local_b8,&nasm::rax::res);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
  }
  peVar1 = (psVar8->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (0x60 < (ulong)((long)(peVar1->args).
                           super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar1->args).
                          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    if (nasm::rsp()::res == '\0') {
      iVar5 = __cxa_guard_acquire(&nasm::rsp()::res);
      if (iVar5 != 0) {
        nasm::rsp::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::rsp::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::rsp::res,
                   (allocator<mocker::nasm::Register> *)local_b8,(char (*) [4])"rsp");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::rsp::res,&__dso_handle);
        __cxa_guard_release(&nasm::rsp()::res);
      }
    }
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
              (local_c0,&nasm::rsp::res,
               (shared_ptr<mocker::nasm::Register> *)&stack0xffffffffffffffc0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_nxt !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_nxt);
  }
  return;
}

Assistant:

void genCall(nasm::Section &text, FuncSelectionContext &ctx,
             const std::shared_ptr<ir::Call> &p) {
  static const std::vector<std::shared_ptr<nasm::Register>> ParamRegs = {
      nasm::rdi(), nasm::rsi(), nasm::rdx(),
      nasm::rcx(), nasm::r8(),  nasm::r9()};
  auto rspCopy = ctx.newVirtualReg();
  text.emplaceInst<nasm::Mov>(rspCopy, nasm::rsp());

  for (std::size_t i = 0; i < 6 && i < p->getArgs().size(); ++i) {
    text.emplaceInst<nasm::Mov>(ParamRegs[i], ctx.getIrAddr(p->getArgs()[i]));
  }
  for (int i = p->getArgs().size() - 1; i >= 6; --i) {
    auto tmp = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(tmp, ctx.getIrAddr(p->getArgs()[i]));
    text.emplaceInst<nasm::Push>(tmp);
  }

  text.emplaceInst<nasm::Call>(renameIdentifier(p->getFuncName()));
  if (p->getDest()) {
    auto retVal = ctx.getIrAddr(p->getDest());
    text.emplaceInst<nasm::Mov>(retVal, nasm::rax());
  }

  if (p->getArgs().size() > 6) {
    text.emplaceInst<nasm::Mov>(nasm::rsp(), rspCopy);
  }
}